

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_actor::state_read(se_actor *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((se_actor *)
             &this[-1].super_cse_alife_creature_actor.super_cse_alife_creature_abstract.field_0xe0,
             in_RSI,in_DX);
  return;
}

Assistant:

void se_actor::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_creature_actor::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		set_save_marker(packet, SM_LOAD, false, "se_actor");
		
		bool start_position_filled = packet.r_bool();
		
		set_save_marker(packet, SM_LOAD, true, "se_actor");
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_LOAD, false, "se_actor");

		// CRandomTask
		set_save_marker(packet, SM_LOAD, false, "CRandomTask");
		if (packet.r_u16())			// #inited_tasks
			xr_not_implemented();
		// CRandomTask's id_generator
		set_save_marker(packet, SM_LOAD, false, "object_collection");
		r_object_collection(packet);
		set_save_marker(packet, SM_LOAD, true, "object_collection");
		if (packet.r_u8())			// #rewards
			xr_not_implemented();
		if (packet.r_u16())			// #inited_find_upgrade_tasks
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CRandomTask");

		// sim_board's id_generator
		set_save_marker(packet, SM_LOAD, false, "object_collection");
		r_object_collection(packet);
		set_save_marker(packet, SM_LOAD, true, "object_collection");

		// CMinigames
		set_save_marker(packet, SM_LOAD, false, "CMinigames");
		if (packet.r_u16() != 2)		// #minigames
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "test_crowkiller"))	// first minigame's name
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "CMGCrowKiller"))	// first minigame's profile
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "valiable"))		// first minigame's state
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, false, "CMGCrowKiller");
		if (packet.r_u8())			// params_list.highscore
			xr_not_implemented();
		if (packet.r_u16() != 60)		// params_list.timer
			xr_not_implemented();
		if (packet.r_bool())			// params_list.win
			xr_not_implemented();
		if (packet.r_u8() != 4)			// #params_list.crows_to_kill
			xr_not_implemented();
		if (packet.r_u32())			// params_list.crows_to_kill
			xr_not_implemented();
		if (packet.r_u16() != 10)		// params_list.money_multiplier
			xr_not_implemented();
		if (packet.r_u16() != 100)		// params_list.champion_multiplier
			xr_not_implemented();
		if (packet.r_u8())			// params_list.selected
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), ""))	// params_list.game_type
			xr_not_implemented();
		if (packet.r_u8())			// high_score
			xr_not_implemented();
		if (packet.r_u16())			// timer
			xr_not_implemented();
		if (packet.r_u16() != 10)		// time_out
			xr_not_implemented();
		if (packet.r_u8())			// killed_counter
			xr_not_implemented();
		if (packet.r_bool())			// win
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CMGCrowKiller");

		if (std::strcmp(packet.skip_sz(), "test_shooting"))	// second minigame's name
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "CMGShooting"))	// second minigame's profile
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "valiable"))		// second minigame's state
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, false, "CMGShooting");
		if (std::strcmp(packet.skip_sz(), ""))		// params_list.game_type
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), ""))		// params_list.wpn_type
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.stand_way
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.look_way
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.stand_way_back
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.look_way_back
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.obj_name
			xr_not_implemented();
		if (packet.r_u8() != 1)				// params_list.win type
			xr_not_implemented();
		if (packet.r_u16())				// params_list.win
			xr_not_implemented();
		if (packet.r_u8())				// params_list.distance
			xr_not_implemented();
		if (packet.r_u8())				// params_list.ammo
			xr_not_implemented();
		if (packet.r_u8())				// #params_list.targets
			xr_not_implemented();
		if (packet.r_u8())				// params_list.target_counter
			xr_not_implemented();
		if (packet.r_u8())				// #inventory_items
			xr_not_implemented();
		if (packet.r_u32())				// prev_time
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// cur_game
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CMGShooting");
		set_save_marker(packet, SM_LOAD, true, "CMinigames");

		set_save_marker(packet, SM_LOAD, true, "se_actor");
	} else if (m_version >= CSE_VERSION_0x27 && m_version <= CSE_VERSION_SOC) {
		// no script entity
	} else {
		xr_not_implemented();
	}
}